

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void Ppmd8_Update1_0(CPpmd8 *p)

{
  byte bVar1;
  CPpmd8 *p_local;
  
  p->PrevSuccess = (uint)(p->MinContext->SummFreq <= (ushort)((ushort)p->FoundState->Freq * 2));
  p->RunLength = p->PrevSuccess + p->RunLength;
  p->MinContext->SummFreq = p->MinContext->SummFreq + 4;
  bVar1 = p->FoundState->Freq + 4;
  p->FoundState->Freq = bVar1;
  if (0x7c < bVar1) {
    Rescale(p);
  }
  NextContext(p);
  return;
}

Assistant:

void Ppmd8_Update1_0(CPpmd8 *p)
{
  p->PrevSuccess = (2 * p->FoundState->Freq >= p->MinContext->SummFreq);
  p->RunLength += p->PrevSuccess;
  p->MinContext->SummFreq += 4;
  if ((p->FoundState->Freq += 4) > MAX_FREQ)
    Rescale(p);
  NextContext(p);
}